

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string_view __thiscall
google::protobuf::Reflection::GetRepeatedStringViewImpl
          (Reflection *this,Message *message,FieldDescriptor *field,int index,ScratchSpace *scratch)

{
  CppStringType CVar1;
  uint32_t uVar2;
  RepeatedField<absl::lts_20250127::Cord> *this_00;
  const_reference cord;
  RepeatedPtrFieldBase *this_01;
  string *psVar3;
  string_view sVar4;
  
  if ((field->field_0x1 & 8) == 0) {
    CVar1 = FieldDescriptor::cpp_string_type(field);
    if ((CVar1 != kView) && (CVar1 != kString)) {
      if (CVar1 == kCord) {
        this_00 = GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                            (this,message,field);
        cord = RepeatedField<absl::lts_20250127::Cord>::Get(this_00,index);
        if (scratch != (ScratchSpace *)0x0) {
          sVar4 = ScratchSpace::CopyFromCord(scratch,cord);
          return sVar4;
        }
        GetRepeatedStringViewImpl();
      }
      GetRepeatedStringViewImpl();
    }
    this_01 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,message,field)
               ->super_RepeatedPtrFieldBase;
    psVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (this_01,index);
  }
  else {
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    psVar3 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        field->number_,index);
  }
  sVar4._M_str = (psVar3->_M_dataplus)._M_p;
  sVar4._M_len = psVar3->_M_string_length;
  return sVar4;
}

Assistant:

absl::string_view Reflection::GetRepeatedStringViewImpl(
    const Message& message, const FieldDescriptor* field, int index,
    ScratchSpace* scratch) const {
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  }

  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      auto& cord = GetRepeatedField<absl::Cord>(message, field, index);
      ABSL_DCHECK(scratch);
      return scratch->CopyFromCord(cord);
    }
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString:
      return GetRepeatedPtrField<std::string>(message, field, index);
  }
  internal::Unreachable();
}